

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkMemoryBarrier2 * __thiscall
Fossilize::StateRecorder::Impl::copy<VkMemoryBarrier2>
          (Impl *this,VkMemoryBarrier2 *src,size_t count,ScratchAllocator *alloc)

{
  VkMemoryBarrier2 *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkMemoryBarrier2 *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkMemoryBarrier2>(alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkMemoryBarrier2_const*,VkMemoryBarrier2*>
                (src,src + count,(VkMemoryBarrier2 *)this_local);
    }
  }
  return (VkMemoryBarrier2 *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}